

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderPrecisionTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::ShaderFloatPrecisionCase::iterate(ShaderFloatPrecisionCase *this)

{
  pointer *this_00;
  float fVar1;
  code *pcVar2;
  double reference;
  float in0_00;
  int iVar3;
  deUint32 dVar4;
  StorageType SVar5;
  qpTestResult qVar6;
  TestLog *this_01;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  float *pfVar9;
  MessageBuilder *pMVar10;
  TestLog *this_02;
  size_type sVar11;
  reference vertexArrays_00;
  reference pvVar12;
  bool bVar13;
  Hex<8UL> local_8f8;
  MessageBuilder local_8f0;
  Float<unsigned_int,_8,_23,_127,_3U> local_76c;
  StorageType local_768;
  int local_764;
  deUint32 pixelBits;
  int x;
  int y;
  StorageType SStack_754;
  bool allPixelsOk;
  undefined1 local_74d;
  deUint32 firstPixelBits;
  bool firstPixelOk;
  Hex<8UL> HStack_748;
  MessageBuilder local_740;
  PrimitiveList local_5c0;
  Float<unsigned_int,_8,_23,_127,_3U> local_5a4;
  Hex<8UL> local_5a0;
  Float<unsigned_int,_8,_23,_127,_3U> local_594;
  Hex<8UL> local_590;
  Float<unsigned_int,_8,_23,_127,_3U> local_584;
  Hex<8UL> local_580;
  MessageBuilder local_578;
  MessageBuilder local_3f8;
  Float<unsigned_long,_11,_52,_1023,_3U> local_278;
  float local_26c;
  double dStack_268;
  float refF;
  double refD;
  float in1;
  float in0;
  int testNdx;
  VertexArrayBinding local_230;
  allocator<char> local_1d9;
  string local_1d8;
  VertexArrayBinding local_1b8;
  allocator<char> local_161;
  string local_160;
  VertexArrayBinding local_140;
  deUint32 local_f0;
  deUint32 prog;
  allocator<float> local_d9;
  undefined1 local_d8 [8];
  vector<float,_std::allocator<float>_> pixels;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> vertexArrays;
  Functions *gl;
  TestLog *log;
  float in1Arr [4];
  float in0Arr [4];
  deUint16 adStack_68 [2];
  int numVertices;
  deUint16 indices [6];
  float position [16];
  ShaderFloatPrecisionCase *this_local;
  long lVar8;
  
  stack0xffffffffffffffa8 = 0xbf800000bf800000;
  _adStack_68 = 0x2000200010000;
  indices[0] = 1;
  indices[1] = 3;
  in1Arr[2] = 0.0;
  in1Arr[3] = 0.0;
  in0Arr[0] = 0.0;
  in0Arr[1] = 0.0;
  log = (TestLog *)0x0;
  in1Arr[0] = 0.0;
  in1Arr[1] = 0.0;
  this_01 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  pRVar7 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar7->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar3);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::vector
            ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
             &pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::allocator<float>::allocator(&local_d9);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_d8,0x1000,&local_d9);
  std::allocator<float>::~allocator(&local_d9);
  local_f0 = glu::ShaderProgram::getProgram(this->m_program);
  (**(code **)(lVar8 + 0x1680))(local_f0);
  (**(code **)(lVar8 + 0x78))(0x8d40,this->m_framebuffer);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"a_position",&local_161);
  glu::va::Float(&local_140,&local_160,4,4,0,(float *)(indices + 4));
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::push_back
            ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
             &pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_140);
  glu::VertexArrayBinding::~VertexArrayBinding(&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"a_in0",&local_1d9);
  glu::va::Float(&local_1b8,&local_1d8,1,4,0,in1Arr + 2);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::push_back
            ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
             &pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_1b8);
  glu::VertexArrayBinding::~VertexArrayBinding(&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testNdx,"a_in1",(allocator<char> *)((long)&in0 + 3));
  glu::va::Float(&local_230,(string *)&testNdx,1,4,0,(float *)&log);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::push_back
            ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
             &pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_230);
  glu::VertexArrayBinding::~VertexArrayBinding(&local_230);
  std::__cxx11::string::~string((string *)&testNdx);
  std::allocator<char>::~allocator((allocator<char> *)((long)&in0 + 3));
  dVar4 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar4,"After program setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderPrecisionTests.cpp"
                  ,0x168);
  for (in1 = 0.0; (int)in1 < this->m_numTestsPerIter; in1 = (float)((int)in1 + 1)) {
    pfVar9 = tcu::Vector<float,_2>::x(&this->m_rangeA);
    fVar1 = *pfVar9;
    pfVar9 = tcu::Vector<float,_2>::y(&this->m_rangeA);
    refD._4_4_ = de::Random::getFloat(&this->m_rnd,fVar1,*pfVar9);
    pfVar9 = tcu::Vector<float,_2>::x(&this->m_rangeB);
    fVar1 = *pfVar9;
    pfVar9 = tcu::Vector<float,_2>::y(&this->m_rangeB);
    refD._0_4_ = de::Random::getFloat(&this->m_rnd,fVar1,*pfVar9);
    dStack_268 = (*this->m_evalFunc)((double)refD._4_4_,(double)refD._0_4_);
    tcu::Float<unsigned_long,_11,_52,_1023,_3U>::Float(&local_278,dStack_268);
    local_26c = tcu::Float<unsigned_long,_11,_52,_1023,_3U>::asFloat(&local_278);
    tcu::TestLog::operator<<(&local_578,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar10 = tcu::MessageBuilder::operator<<(&local_578,(char (*) [6])"iter ");
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&this->m_iterNdx);
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [8])", test ");
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(int *)&in1);
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x12835f3);
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [7])0x127595f);
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(float *)((long)&refD + 4));
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [4])0x12c5a14);
    tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_584,refD._4_4_);
    SVar5 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::bits(&local_584);
    local_580 = tcu::toHex<unsigned_int>(SVar5);
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_580);
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [9])", in1 = ");
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(float *)&refD);
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [4])0x12c5a14);
    tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_594,refD._0_4_);
    SVar5 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::bits(&local_594);
    local_590 = tcu::toHex<unsigned_int>(SVar5);
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_590);
    this_02 = tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::TestLog::operator<<(&local_3f8,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar10 = tcu::MessageBuilder::operator<<(&local_3f8,(char (*) [15])"  reference = ");
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_26c);
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [4])0x12c5a14);
    tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_5a4,local_26c);
    SVar5 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::bits(&local_5a4);
    local_5a0 = tcu::toHex<unsigned_int>(SVar5);
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_5a0);
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_3f8);
    tcu::MessageBuilder::~MessageBuilder(&local_578);
    std::fill<float*,float>(in1Arr + 2,in0Arr + 2,(float *)((long)&refD + 4));
    std::fill<float*,float>((float *)&log,in1Arr + 2,(float *)&refD);
    pRVar7 = Context::getRenderContext((this->super_TestCase).m_context);
    dVar4 = local_f0;
    this_00 = &pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    sVar11 = std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::size
                       ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *
                        )this_00);
    vertexArrays_00 =
         std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::operator[]
                   ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
                    this_00,0);
    glu::pr::Triangles(&local_5c0,6,adStack_68);
    glu::draw(pRVar7,dVar4,(int)sVar11,vertexArrays_00,&local_5c0,(DrawUtilCallback *)0x0);
    pcVar2 = *(code **)(lVar8 + 0x1220);
    pvVar12 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)local_d8,0);
    (*pcVar2)(0,0,0x20,0x20,0x8d99,0x1405,pvVar12);
    dVar4 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar4,"After render",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderPrecisionTests.cpp"
                    ,0x17e);
    tcu::TestLog::operator<<(&local_740,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar10 = tcu::MessageBuilder::operator<<(&local_740,(char (*) [12])"  result = ");
    pvVar12 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)local_d8,0);
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,pvVar12);
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [4])0x12c5a14);
    pvVar12 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)local_d8,0);
    tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float
              ((Float<unsigned_int,_8,_23,_127,_3U> *)&firstPixelBits,*pvVar12);
    SVar5 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::bits
                      ((Float<unsigned_int,_8,_23,_127,_3U> *)&firstPixelBits);
    HStack_748 = tcu::toHex<unsigned_int>(SVar5);
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&stack0xfffffffffffff8b8);
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_740);
    in0_00 = refD._4_4_;
    fVar1 = refD._0_4_;
    reference = dStack_268;
    pvVar12 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)local_d8,0);
    local_74d = compare(this,in0_00,fVar1,reference,*pvVar12);
    if ((bool)local_74d) {
      pvVar12 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_d8,0);
      tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float
                ((Float<unsigned_int,_8,_23,_127,_3U> *)&y,*pvVar12);
      SStack_754 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::bits
                             ((Float<unsigned_int,_8,_23,_127,_3U> *)&y);
      x._3_1_ = 1;
      for (pixelBits = 0; (int)pixelBits < 0x20; pixelBits = pixelBits + 1) {
        for (local_764 = 0; local_764 < 0x20; local_764 = local_764 + 1) {
          pvVar12 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)local_d8,
                               (long)(int)((pixelBits * 0x20 + local_764) * 4));
          tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_76c,*pvVar12);
          local_768 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::bits(&local_76c);
          if (local_768 != SStack_754) {
            tcu::TestLog::operator<<(&local_8f0,this_01,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar10 = tcu::MessageBuilder::operator<<
                                (&local_8f0,(char (*) [34])"ERROR: Inconsistent results, got ");
            local_8f8 = tcu::toHex<unsigned_int>(local_768);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_8f8);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [6])0x130d130);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_764);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x12ed2ef);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(int *)&pixelBits);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x130f08e);
            tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_8f0);
            x._3_1_ = 0;
          }
        }
        if ((x._3_1_ & 1) == 0) break;
      }
      if ((x._3_1_ & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Inconsistent values in framebuffer");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Result comparison failed");
    }
    qVar6 = tcu::TestContext::getTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    if (qVar6 != QP_TEST_RESULT_PASS) break;
  }
  pcVar2 = *(code **)(lVar8 + 0x78);
  pRVar7 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar7->_vptr_RenderContext[6])();
  (*pcVar2)(0x8d40,iVar3);
  dVar4 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar4,"After iteration",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderPrecisionTests.cpp"
                  ,0x1a9);
  this->m_iterNdx = this->m_iterNdx + 1;
  bVar13 = false;
  if (this->m_iterNdx < this->m_numIters) {
    qVar6 = tcu::TestContext::getTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    bVar13 = qVar6 == QP_TEST_RESULT_PASS;
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_d8);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
            ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
             &pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return (uint)bVar13;
}

Assistant:

ShaderFloatPrecisionCase::IterateResult ShaderFloatPrecisionCase::iterate (void)
{
	// Constant data.
	const float position[] =
	{
		-1.0f, -1.0f, 0.0f, 1.0f,
		-1.0f,  1.0f, 0.0f, 1.0f,
		 1.0f, -1.0f, 0.0f, 1.0f,
		 1.0f,  1.0f, 0.0f, 1.0f
	};
	const deUint16					indices[]	= { 0, 1, 2, 2, 1, 3 };

	const int						numVertices	= 4;
	float							in0Arr[4]	= { 0.0f };
	float							in1Arr[4]	= { 0.0f };

	TestLog&						log			= m_testCtx.getLog();
	const glw::Functions&			gl			= m_context.getRenderContext().getFunctions();
	vector<glu::VertexArrayBinding>	vertexArrays;

	// Image read from GL.
	std::vector<float>	pixels		(FRAMEBUFFER_WIDTH*FRAMEBUFFER_HEIGHT*4);

	// \todo [2012-05-03 pyry] Could be cached.
	deUint32			prog		= m_program->getProgram();

	gl.useProgram(prog);
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);

	vertexArrays.push_back(glu::va::Float("a_position", 4, numVertices, 0, &position[0]));
	vertexArrays.push_back(glu::va::Float("a_in0", 1, numVertices, 0, &in0Arr[0]));
	vertexArrays.push_back(glu::va::Float("a_in1", 1, numVertices, 0, &in1Arr[0]));

	GLU_EXPECT_NO_ERROR(gl.getError(), "After program setup");

	// Compute values and reference.
	for (int testNdx = 0; testNdx < m_numTestsPerIter; testNdx++)
	{
		const float		in0		= m_rnd.getFloat(m_rangeA.x(), m_rangeA.y());
		const float		in1		= m_rnd.getFloat(m_rangeB.x(), m_rangeB.y());
		const double	refD	= m_evalFunc((double)in0, (double)in1);
		const float		refF	= tcu::Float64(refD).asFloat(); // Uses RTE rounding mode.

		log << TestLog::Message << "iter " << m_iterNdx << ", test " << testNdx << ": "
								<< "in0 = " << in0 << " / " << tcu::toHex(tcu::Float32(in0).bits())
								<< ", in1 = " << in1 << " / " << tcu::toHex(tcu::Float32(in1).bits())
			<< TestLog::EndMessage
			<< TestLog::Message << "  reference = " << refF << " / " << tcu::toHex(tcu::Float32(refF).bits()) << TestLog::EndMessage;

		std::fill(&in0Arr[0], &in0Arr[0] + DE_LENGTH_OF_ARRAY(in0Arr), in0);
		std::fill(&in1Arr[0], &in1Arr[0] + DE_LENGTH_OF_ARRAY(in1Arr), in1);

		glu::draw(m_context.getRenderContext(), prog, (int)vertexArrays.size(), &vertexArrays[0],
				  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
		gl.readPixels(0, 0, FRAMEBUFFER_WIDTH, FRAMEBUFFER_HEIGHT, GL_RGBA_INTEGER, GL_UNSIGNED_INT, &pixels[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "After render");

		log << TestLog::Message << "  result = " << pixels[0] << " / " << tcu::toHex(tcu::Float32(pixels[0]).bits()) << TestLog::EndMessage;

		// Verify results
		{
			const bool firstPixelOk = compare(in0, in1, refD, pixels[0]);

			if (firstPixelOk)
			{
				// Check that rest of pixels match to first one.
				const deUint32	firstPixelBits	= tcu::Float32(pixels[0]).bits();
				bool			allPixelsOk		= true;

				for (int y = 0; y < FRAMEBUFFER_HEIGHT; y++)
				{
					for (int x = 0; x < FRAMEBUFFER_WIDTH; x++)
					{
						const deUint32 pixelBits = tcu::Float32(pixels[(y*FRAMEBUFFER_WIDTH + x)*4]).bits();

						if (pixelBits != firstPixelBits)
						{
							log << TestLog::Message << "ERROR: Inconsistent results, got " << tcu::toHex(pixelBits) << " at (" << x << ", " << y << ")" << TestLog::EndMessage;
							allPixelsOk = false;
						}
					}

					if (!allPixelsOk)
						break;
				}

				if (!allPixelsOk)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Inconsistent values in framebuffer");
			}
			else
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Result comparison failed");
		}

		if (m_testCtx.getTestResult() != QP_TEST_RESULT_PASS)
			break;
	}

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());
	GLU_EXPECT_NO_ERROR(gl.getError(), "After iteration");

	m_iterNdx += 1;
	return (m_iterNdx < m_numIters && m_testCtx.getTestResult() == QP_TEST_RESULT_PASS) ? CONTINUE : STOP;
}